

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

bool __thiscall
Js::FunctionBody::
MapEntryPointsUntil<BailOutRecord::ScheduleFunctionCodeGen(Js::ScriptFunction*,Js::ScriptFunction*,BailOutRecord_const*,IR::BailOutKind,unsigned_int,Js::ImplicitCallFlags,void*)::__0>
          (FunctionBody *this,anon_class_16_2_b7ce67e3 fn)

{
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  **ppSVar1;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *this_00;
  FunctionBody *this_local;
  anon_class_16_2_b7ce67e3 fn_local;
  
  fn_local.foundEntryPoint = (bool *)fn.entryPointInfo;
  this_local = (FunctionBody *)fn.foundEntryPoint;
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_SynchronizableList__
                      ((WriteBarrierPtr *)&this->entryPoints);
  if (*ppSVar1 ==
      (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
       *)0x0) {
    fn_local.entryPointInfo._7_1_ = false;
  }
  else {
    this_00 = Memory::
              WriteBarrierPtr<Js::SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>_>
              ::operator->(&this->entryPoints);
    fn_local.entryPointInfo._7_1_ =
         SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>,Js::DefaultContainerLockPolicy,CriticalSection>
         ::
         MapUntil<Js::FunctionBody::MapEntryPointsUntil<BailOutRecord::ScheduleFunctionCodeGen(Js::ScriptFunction*,Js::ScriptFunction*,BailOutRecord_const*,IR::BailOutKind,unsigned_int,Js::ImplicitCallFlags,void*)::__0>(BailOutRecord::ScheduleFunctionCodeGen(Js::ScriptFunction*,Js::ScriptFunction*,BailOutRecord_const*,IR::BailOutKind,unsigned_int,Js::ImplicitCallFlags,void*)::__0)const::_lambda(int,Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*)_1_>
                   ((SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>,Js::DefaultContainerLockPolicy,CriticalSection>
                     *)this_00,(anon_class_16_2_b7ce67e3 *)&this_local);
  }
  return fn_local.entryPointInfo._7_1_;
}

Assistant:

bool MapEntryPointsUntil(Fn fn) const
        {
            if (this->entryPoints)
            {
                return this->entryPoints->MapUntil([&fn](int index, RecyclerWeakReference<FunctionEntryPointInfo>* entryPoint) {
                    FunctionEntryPointInfo* strongRef = entryPoint->Get();
                    if (strongRef)
                    {
                        return fn(index, strongRef);
                    }
                    return false;
                });
            }
            return false;
        }